

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  size_t *psVar1;
  application *app;
  _data *p_Var2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  legacy_async_pool *__p;
  _Node *p_Var4;
  shared_ptr<cppcms::application_specific_pool> p;
  unique_lock<std::recursive_mutex> lock;
  intrusive_ptr<cppcms::application> local_90;
  application_specific_pool *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  shared_ptr<cppcms::application_specific_pool> local_78;
  unique_lock<std::recursive_mutex> local_68;
  attachment local_58;
  
  __p = (legacy_async_pool *)operator_new(0x28);
  app = *(application **)__special_file;
  local_90.p_ = app;
  if (app != (application *)0x0) {
    booster::intrusive_ptr_add_ref(app);
  }
  application_specific_pool::application_specific_pool((application_specific_pool *)__p);
  (__p->super_application_specific_pool)._vptr_application_specific_pool =
       (_func_int **)&PTR__application_specific_pool_00285b30;
  __p->my_ = app;
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::legacy_async_pool,void>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)&local_88
             ,__p);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_90);
  ((local_88->d).ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags(local_88,0x8001);
  local_68._M_device = &((this->d).ptr_)->lock;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  local_68._M_owns = true;
  p_Var2 = (this->d).ptr_;
  local_78.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_88;
  local_78.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_80;
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_80->_M_use_count = local_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_80->_M_use_count = local_80->_M_use_count + 1;
    }
  }
  _data::attachment::attachment(&local_58,&local_78,(mount_point *)__dir);
  p_Var4 = std::__cxx11::
           list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ::_M_create_node<cppcms::applications_pool::_data::attachment>
                     (&p_Var2->legacy_async_apps,&local_58);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(p_Var2->legacy_async_apps).
            super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_58.pool.
      super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.pool.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  mount_point::~mount_point(&local_58.mp);
  if (local_78.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  iVar3 = extraout_EAX;
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    iVar3 = extraout_EAX_00;
  }
  return iVar3;
}

Assistant:

void applications_pool::mount(booster::intrusive_ptr<application> app,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_async_pool(app));
	p->size(d->thread_count);
	p->flags(app::legacy | app::asynchronous);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->legacy_async_apps.push_back(_data::attachment(p,mp));
}